

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int __thiscall QObject::senderSignalIndex(QObject *this)

{
  long lVar1;
  int __sig;
  Type pCVar2;
  QMetaMethod *this_00;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Connection *c;
  ConnectionData *cd;
  QObjectPrivate *d;
  QMutexLocker<QBasicMutex> locker;
  QBasicMutex *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Connection *local_58;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QObject *)0x3efb30);
  signalSlotLock(in_RDI);
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  pCVar2 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3efb7b);
  if ((pCVar2 == (Type)0x0) || (pCVar2->currentSender == (Sender *)0x0)) {
    local_2c = -1;
  }
  else {
    for (local_58 = pCVar2->senders; local_58 != (Connection *)0x0;
        local_58 = (local_58->super_ConnectionOrSignalVector).field_0.next) {
      if (local_58->sender == pCVar2->currentSender->sender) {
        __sig = (**local_58->sender->_vptr_QObject)();
        QMetaObjectPrivate::signal(__sig,(__sighandler_t)(ulong)(uint)pCVar2->currentSender->signal)
        ;
        in_stack_ffffffffffffff74 = QMetaMethod::methodIndex(this_00);
        local_2c = in_stack_ffffffffffffff74;
        goto LAB_003efc94;
      }
    }
    local_2c = -1;
  }
LAB_003efc94:
  QMutexLocker<QBasicMutex>::~QMutexLocker
            ((QMutexLocker<QBasicMutex> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::senderSignalIndex() const
{
    Q_D(const QObject);

    QMutexLocker locker(signalSlotLock(this));
    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (!cd || !cd->currentSender)
        return -1;

    for (QObjectPrivate::Connection *c = cd->senders; c; c = c->next) {
        if (c->sender == cd->currentSender->sender) {
            // Convert from signal range to method range
            return QMetaObjectPrivate::signal(c->sender->metaObject(), cd->currentSender->signal).methodIndex();
        }
    }

    return -1;
}